

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_pcache * pcache1Create(int szPage,int szExtra,int bPurgeable)

{
  PgHdr1 *pPVar1;
  PCacheGlobal *pPStack_28;
  int sz;
  PGroup *pGroup;
  PCache1 *pCache;
  int bPurgeable_local;
  int szExtra_local;
  int szPage_local;
  
  pGroup = (PGroup *)sqlite3MallocZero((long)(pcache1_g.separateCache * 0x50 + 0x58));
  if ((PCache1 *)pGroup != (PCache1 *)0x0) {
    if (pcache1_g.separateCache == 0) {
      pPStack_28 = &pcache1_g;
    }
    else {
      pPStack_28 = (PCacheGlobal *)((long)pGroup + 0x58);
      ((PCache1 *)((long)pGroup + 0x58))->szPage = 10;
    }
    if ((pPStack_28->grp).lru.isAnchor == 0) {
      (pPStack_28->grp).lru.isAnchor = 1;
      pPVar1 = &(pPStack_28->grp).lru;
      (pPStack_28->grp).lru.pLruNext = pPVar1;
      (pPStack_28->grp).lru.pLruPrev = pPVar1;
    }
    ((PCache1 *)pGroup)->pGroup = &pPStack_28->grp;
    ((PCache1 *)pGroup)->szPage = szPage;
    ((PCache1 *)pGroup)->szExtra = szExtra;
    ((PCache1 *)pGroup)->szAlloc = szPage + szExtra + 0x38;
    ((PCache1 *)pGroup)->bPurgeable = (uint)(bPurgeable != 0);
    pcache1ResizeHash((PCache1 *)pGroup);
    if (bPurgeable == 0) {
      ((PCache1 *)pGroup)->pnPurgeable = &((PCache1 *)pGroup)->nPurgeableDummy;
    }
    else {
      ((PCache1 *)pGroup)->nMin = 10;
      (pPStack_28->grp).nMinPage = ((PCache1 *)pGroup)->nMin + (pPStack_28->grp).nMinPage;
      (pPStack_28->grp).mxPinned = ((pPStack_28->grp).nMaxPage + 10) - (pPStack_28->grp).nMinPage;
      ((PCache1 *)pGroup)->pnPurgeable = &(pPStack_28->grp).nPurgeable;
    }
    if (((PCache1 *)pGroup)->nHash == 0) {
      pcache1Destroy((sqlite3_pcache *)pGroup);
      pGroup = (PGroup *)0x0;
    }
  }
  return (sqlite3_pcache *)pGroup;
}

Assistant:

static sqlite3_pcache *pcache1Create(int szPage, int szExtra, int bPurgeable){
  PCache1 *pCache;      /* The newly created page cache */
  PGroup *pGroup;       /* The group the new page cache will belong to */
  int sz;               /* Bytes of memory required to allocate the new cache */

  assert( (szPage & (szPage-1))==0 && szPage>=512 && szPage<=65536 );
  assert( szExtra < 300 );

  sz = sizeof(PCache1) + sizeof(PGroup)*pcache1.separateCache;
  pCache = (PCache1 *)sqlite3MallocZero(sz);
  if( pCache ){
    if( pcache1.separateCache ){
      pGroup = (PGroup*)&pCache[1];
      pGroup->mxPinned = 10;
    }else{
      pGroup = &pcache1.grp;
    }
    pcache1EnterMutex(pGroup);
    if( pGroup->lru.isAnchor==0 ){
      pGroup->lru.isAnchor = 1;
      pGroup->lru.pLruPrev = pGroup->lru.pLruNext = &pGroup->lru;
    }
    pCache->pGroup = pGroup;
    pCache->szPage = szPage;
    pCache->szExtra = szExtra;
    pCache->szAlloc = szPage + szExtra + ROUND8(sizeof(PgHdr1));
    pCache->bPurgeable = (bPurgeable ? 1 : 0);
    pcache1ResizeHash(pCache);
    if( bPurgeable ){
      pCache->nMin = 10;
      pGroup->nMinPage += pCache->nMin;
      pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
      pCache->pnPurgeable = &pGroup->nPurgeable;
    }else{
      pCache->pnPurgeable = &pCache->nPurgeableDummy;
    }
    pcache1LeaveMutex(pGroup);
    if( pCache->nHash==0 ){
      pcache1Destroy((sqlite3_pcache*)pCache);
      pCache = 0;
    }
  }
  return (sqlite3_pcache *)pCache;
}